

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::computeQuadTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,Vec2 *bottomLeft,Vec2 *topRight)

{
  float *pfVar1;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,8);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = bottomLeft->m_data[0];
  pfVar1[1] = bottomLeft->m_data[1];
  pfVar1[2] = bottomLeft->m_data[0];
  pfVar1[3] = topRight->m_data[1];
  pfVar1[4] = topRight->m_data[0];
  pfVar1[5] = bottomLeft->m_data[1];
  pfVar1[6] = topRight->m_data[0];
  pfVar1[7] = topRight->m_data[1];
  return;
}

Assistant:

void computeQuadTexCoord2D (std::vector<float>& dst, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight)
{
	dst.resize(4*2);

	dst[0] = bottomLeft.x();	dst[1] = bottomLeft.y();
	dst[2] = bottomLeft.x();	dst[3] = topRight.y();
	dst[4] = topRight.x();		dst[5] = bottomLeft.y();
	dst[6] = topRight.x();		dst[7] = topRight.y();
}